

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O1

int anon_unknown.dwarf_124eb::RtMidiIn_getcurrentapi(lua_State *L)

{
  int iVar1;
  RtMidiIn *pRVar2;
  
  lua_getfield(L,0xfff0b9d8,"luartmidi.rtmidiin");
  pRVar2 = luaGetUserdata<RtMidiIn>(L,1,"RtMidiIn");
  iVar1 = (*((pRVar2->super_RtMidi).rtapi_)->_vptr_MidiApi[2])();
  lua_pushinteger(L,iVar1);
  return 1;
}

Assistant:

int RtMidiIn_getcurrentapi(lua_State *L) {
	auto &self = getRtMidiIn(L, 1);
	lua_pushinteger(L, self.getCurrentApi());
	return 1;
}